

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evaluate.cpp
# Opt level: O0

void eval(Board *brd,Block *block,int *ele,int *ht)

{
  pair<int,_int> pVar1;
  int *in_RCX;
  int *in_RDX;
  Block *in_RSI;
  Board *in_RDI;
  Block *unaff_retaddr;
  int i;
  pair<int,_int> elim;
  int basenum;
  int local_30;
  int local_2c;
  
  Board::place(in_RDI,in_RSI);
  pVar1 = Board::eliminate(_i,unaff_retaddr);
  local_2c = pVar1.first;
  *in_RDX = local_2c;
  local_30 = 0x14;
  while( true ) {
    if (local_30 < 1) {
      return;
    }
    if (in_RDI->rows[local_30] != 0x801) break;
    local_30 = local_30 + -1;
  }
  *in_RCX = local_30;
  return;
}

Assistant:

void eval(Board& brd, const Block& block, int& ele, int& ht) {
    int basenum = brd.place(block);
    pair<int, int> elim=brd.eliminate(&block);
    ele = elim.first;
    for (int i = MAPHEIGHT; i > 0; --i)
        if (brd.rows[i]!=Board::EMPTY_ROW) {
            ht = i;
            break;
        }
}